

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_GenFsm(char *pFileName,int nPis,int nPos,int nStates,int nLines,int ProbI,int ProbO)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Wrd_t *p;
  word *pwVar4;
  Vec_Str_t *vCond;
  FILE *__stream;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  undefined4 in_register_0000008c;
  ulong uVar8;
  uint uVar9;
  char *local_68;
  
  uVar1 = (ulong)(uint)nLines;
  uVar9 = nStates;
  if (1 < (uint)nStates) {
    uVar6 = (ulong)(nStates - 1);
    uVar9 = 0;
    do {
      uVar2 = (uint)uVar6;
      uVar6 = uVar6 / 10;
      uVar9 = uVar9 + 1;
    } while (9 < uVar2);
  }
  Aig_ManRandom(1);
  p = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < nLines - 1U) {
    iVar7 = nLines;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    pwVar4 = (word *)0x0;
  }
  else {
    pwVar4 = (word *)malloc((long)iVar7 << 3);
  }
  p->pArray = pwVar4;
  vCond = (Vec_Str_t *)malloc(0x10);
  vCond->nCap = 1000;
  vCond->nSize = 0;
  local_68 = (char *)malloc(1000);
  vCond->pArray = local_68;
  iVar7 = 0;
  if (0 < nStates) {
    uVar6 = 0;
    do {
      do {
        uVar2 = Aig_ManRandom(0);
      } while (uVar6 == (ulong)uVar2 % (ulong)(uint)nStates);
      Vec_WrdPush(p,uVar6 << 0x20 | (ulong)uVar2 % (ulong)(uint)nStates);
      uVar6 = uVar6 + 1;
      iVar7 = nStates;
    } while (uVar6 != (uint)nStates);
  }
  if (iVar7 < nLines) {
    do {
      do {
        uVar2 = Aig_ManRandom(0);
        uVar3 = Aig_ManRandom(0);
      } while (uVar3 % (uint)nStates == (uint)((ulong)uVar2 % (ulong)(uint)nStates));
      Vec_WrdPush(p,(long)(int)(uVar3 % (uint)nStates) | (ulong)uVar2 % (ulong)(uint)nStates << 0x20
                 );
      iVar7 = iVar7 + 1;
    } while (iVar7 != nLines);
  }
  uVar2 = p->nSize;
  uVar6 = (ulong)uVar2;
  pwVar4 = p->pArray;
  qsort(pwVar4,(long)(int)uVar2,8,Vec_WrdSortCompare1);
  __stream = fopen(pFileName,"w");
  pcVar5 = Extra_TimeStamp();
  fprintf(__stream,"# This random FSM was generated by ABC on %s\n",pcVar5);
  fprintf(__stream,"# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n",
          (ulong)(uint)nPis,(ulong)(uint)nPos,(ulong)(uint)nStates,uVar1,
          CONCAT44(in_register_0000008c,ProbI),(ulong)(uint)ProbO,pFileName);
  fprintf(__stream,"# FSM has %d inputs, %d outputs, %d states, and %d products\n",(ulong)(uint)nPis
          ,(ulong)(uint)nPos,(ulong)(uint)nStates,uVar1);
  fprintf(__stream,".i %d\n",(ulong)(uint)nPis);
  fprintf(__stream,".o %d\n",(ulong)(uint)nPos);
  fprintf(__stream,".p %d\n",uVar1);
  fprintf(__stream,".s %d\n",(ulong)(uint)nStates);
  if (0 < nLines) {
    if ((int)uVar2 < 1) {
      uVar6 = 0;
    }
    uVar8 = 0;
    do {
      Abc_GenFsmCond(vCond,nPis,ProbI);
      local_68 = vCond->pArray;
      fprintf(__stream,"%s ");
      if (uVar6 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      fprintf(__stream,"%0*d ",(ulong)uVar9,(ulong)*(uint *)((long)pwVar4 + uVar8 * 8 + 4));
      fprintf(__stream,"%0*d ",(ulong)uVar9,(ulong)(uint)pwVar4[uVar8]);
      if (0 < nPos) {
        Abc_GenFsmCond(vCond,nPos,ProbO);
        local_68 = vCond->pArray;
        fputs(local_68,__stream);
      }
      fputc(10,__stream);
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  fwrite(".e",2,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
  }
  free(p);
  if (local_68 != (char *)0x0) {
    free(local_68);
  }
  free(vCond);
  return;
}

Assistant:

void Abc_GenFsm( char * pFileName, int nPis, int nPos, int nStates, int nLines, int ProbI, int ProbO )
{
    FILE * pFile;
    Vec_Wrd_t * vStates;
    Vec_Str_t * vCond;
    int i, iState, iState2;
    int nDigits = Abc_Base10Log( nStates );
    Aig_ManRandom( 1 );
    vStates = Vec_WrdAlloc( nLines );
    vCond = Vec_StrAlloc( 1000 );
    for ( i = 0; i < nStates; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        if ( iState == i )
            continue;
        Vec_WrdPush( vStates, ((word)i << 32) | iState );
        i++;
    }
    for (      ; i < nLines; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        iState2 = Aig_ManRandom( 0 ) % nStates;
        if ( iState2 == iState )
            continue;
        Vec_WrdPush( vStates, ((word)iState << 32) | iState2 );
        i++;
    }
    Vec_WrdSort( vStates, 0 );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# This random FSM was generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n", nPis, nPos, nStates, nLines, ProbI, ProbO, pFileName );
    fprintf( pFile, "# FSM has %d inputs, %d outputs, %d states, and %d products\n", nPis, nPos, nStates, nLines );
    fprintf( pFile, ".i %d\n", nPis );
    fprintf( pFile, ".o %d\n", nPos );
    fprintf( pFile, ".p %d\n", nLines );
    fprintf( pFile, ".s %d\n", nStates );
    for ( i = 0; i < nLines; i++ )
    {
        Abc_GenFsmCond( vCond, nPis, ProbI );
        fprintf( pFile, "%s ", Vec_StrArray(vCond) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i) >> 32) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i)) );
        if ( nPos > 0 )
        {
            Abc_GenFsmCond( vCond, nPos, ProbO );
            fprintf( pFile, "%s", Vec_StrArray(vCond) );
        }
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e" );
    fprintf( pFile, "\n" );
    fclose( pFile );
    Vec_WrdFree( vStates );
    Vec_StrFree( vCond );
}